

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  long *plVar1;
  string *this_00;
  
  switch((this->super_MapValueConstRef).type_) {
  case CPPTYPE_INT32:
  case CPPTYPE_INT64:
  case CPPTYPE_UINT32:
  case CPPTYPE_UINT64:
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_BOOL:
  case CPPTYPE_ENUM:
    operator_delete((this->super_MapValueConstRef).data_);
    return;
  case CPPTYPE_STRING:
    this_00 = (string *)(this->super_MapValueConstRef).data_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
    }
    operator_delete(this_00);
    return;
  case CPPTYPE_MESSAGE:
    plVar1 = (long *)(this->super_MapValueConstRef).data_;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      return;
    }
  }
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    delete reinterpret_cast<TYPE*>(data_);   \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32_t);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }